

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O2

void test_3d_dynamic<1ul,1ul,1ul>(void)

{
  _Head_base<1UL,_int,_false> _Var1;
  _Head_base<0UL,_int,_false> _Var2;
  _Head_base<2UL,_int,_false> _Var3;
  pointer ptVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  size_type sVar8;
  reference pvVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  _Head_base<1UL,_int,_false> local_9c;
  _Head_base<0UL,_int,_false> local_98;
  _Head_base<2UL,_int,_false> local_94;
  value_type true_idx;
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> data;
  tuple<int,_int,_int> *local_70;
  pointer local_68;
  layout_mapping_left<dimensions<dyn,_dyn,_dyn>,_dimensions<1,_1,_1>,_dimensions<0,_0,_0>_> l;
  
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  true_idx = 1;
  local_70 = (pointer)0x1;
  std::experimental::
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
  ::layout_mapping_regular_precomputed_strides<unsigned_long,unsigned_long,unsigned_long>
            ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
              *)&l,(unsigned_long *)&data,&true_idx,(unsigned_long *)&local_70);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.
                         super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x131,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",(bool *)&data,
             (bool *)&true_idx);
  iVar11 = 0;
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)data.
                        super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  true_idx = true_idx & 0xffffffffffffff00;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x133,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",(bool *)&data,
             (bool *)&true_idx);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.
                         super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(1))","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x134,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",(bool *)&data,
             (bool *)&true_idx);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.
                         super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(2))","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x135,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",(bool *)&data,
             (bool *)&true_idx);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                ::stride(&l,0);
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x137,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",(unsigned_long *)&data,
             (int *)&true_idx);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                ::stride(&l,1);
  true_idx = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(1))","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x138,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",(unsigned_long *)&data,
             &true_idx);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                ::stride(&l,2);
  true_idx = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(2))","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x139,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",(unsigned_long *)&data,
             &true_idx);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                size((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                      *)&l);
  vVar5 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&l,0);
  vVar6 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&l,1);
  vVar7 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&l,2);
  true_idx = vVar7 * vVar6 * vVar5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","l[0] * l[1] * l[2]",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x13b,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",(unsigned_long *)&data,
             &true_idx);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::experimental::detail::
                layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                ::span(&l.
                        super_layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                      );
  vVar5 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&l,0);
  vVar6 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&l,1);
  vVar7 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&l,2);
  true_idx = vVar7 * vVar6 * vVar5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","l[0] * l[1] * l[2]",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x13c,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",(unsigned_long *)&data,
             &true_idx);
  vVar5 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&l,0);
  vVar6 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&l,1);
  vVar7 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&l,2);
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::vector
            (&data,vVar5 * vVar6 * vVar7,(allocator_type *)&true_idx);
  ptVar4 = data.
           super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    local_94._M_head_impl = iVar11;
    vVar5 = std::experimental::
            dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                             *)&l,2);
    if (vVar5 <= (ulong)(long)iVar11) break;
    local_9c._M_head_impl = 0;
    while( true ) {
      uVar12 = (ulong)local_9c._M_head_impl;
      vVar5 = std::experimental::
              dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                               *)&l,1);
      if (vVar5 <= uVar12) break;
      local_98._M_head_impl = 0;
      while( true ) {
        uVar12 = (ulong)local_98._M_head_impl;
        vVar5 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)&l,0);
        if (vVar5 <= uVar12) break;
        lVar13 = (long)local_98._M_head_impl;
        vVar5 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)&l,0);
        lVar10 = (long)local_9c._M_head_impl;
        vVar6 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)&l,0);
        vVar7 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)&l,1);
        true_idx = vVar7 * vVar6 * (long)local_94._M_head_impl + lVar10 * vVar5 + lVar13;
        local_70 = (tuple<int,_int,_int> *)
                   std::experimental::
                   layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                   ::index<int,int,int>
                             ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                               *)&l,local_98._M_head_impl,local_9c._M_head_impl,
                              local_94._M_head_impl);
        boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                  ("(l.index(i, j, k))","true_idx",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x148,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",
                   (unsigned_long *)&local_70,&true_idx);
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,local_98._M_head_impl,local_9c._M_head_impl,local_94._M_head_impl);
        local_70 = ptVar4 + sVar8;
        local_68 = ptVar4 + true_idx;
        boost::detail::test_eq_impl<std::tuple<int,int,int>*,std::tuple<int,int,int>*>
                  ("&(dptr[l.index(i, j, k)])","&(dptr[true_idx])",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x14a,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",&local_70,&local_68);
        _Var2._M_head_impl = local_98._M_head_impl;
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,local_98._M_head_impl,local_9c._M_head_impl,local_94._M_head_impl);
        _Var1._M_head_impl = local_9c._M_head_impl;
        ptVar4[sVar8].super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
        _M_head_impl = _Var2._M_head_impl;
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,local_98._M_head_impl,local_9c._M_head_impl,local_94._M_head_impl);
        _Var3._M_head_impl = local_94._M_head_impl;
        ptVar4[sVar8].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl = _Var1._M_head_impl;
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,local_98._M_head_impl,local_9c._M_head_impl,local_94._M_head_impl);
        ptVar4[sVar8].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
             _Var3._M_head_impl;
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,local_98._M_head_impl,local_9c._M_head_impl,local_94._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(dptr[l.index(i, j, k)]))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x150,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",
                   &ptVar4[sVar8].super__Tuple_impl<0UL,_int,_int,_int>.
                    super__Head_base<0UL,_int,_false>._M_head_impl,&local_98._M_head_impl);
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,local_98._M_head_impl,local_9c._M_head_impl,local_94._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(dptr[l.index(i, j, k)]))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x151,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",
                   &ptVar4[sVar8].super__Tuple_impl<0UL,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl,
                   &local_9c._M_head_impl);
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,local_98._M_head_impl,local_9c._M_head_impl,local_94._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(dptr[l.index(i, j, k)]))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x152,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",
                   (int *)(ptVar4 + sVar8),&local_94._M_head_impl);
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,local_98._M_head_impl,local_9c._M_head_impl,local_94._M_head_impl);
        pvVar9 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 ::at(&data,sVar8);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(data.at(l.index(i, j, k))))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x155,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",
                   &(pvVar9->super__Tuple_impl<0UL,_int,_int,_int>).
                    super__Head_base<0UL,_int,_false>._M_head_impl,&local_98._M_head_impl);
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,local_98._M_head_impl,local_9c._M_head_impl,local_94._M_head_impl);
        pvVar9 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 ::at(&data,sVar8);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(data.at(l.index(i, j, k))))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x156,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",
                   &(pvVar9->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>
                    .super__Head_base<1UL,_int,_false>._M_head_impl,&local_9c._M_head_impl);
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,local_98._M_head_impl,local_9c._M_head_impl,local_94._M_head_impl);
        pvVar9 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 ::at(&data,sVar8);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(data.at(l.index(i, j, k))))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x157,"void test_3d_dynamic() [X = 1UL, Y = 1UL, Z = 1UL]",(int *)pvVar9,
                   &local_94._M_head_impl);
        local_98._M_head_impl = local_98._M_head_impl + 1;
      }
      local_9c._M_head_impl = local_9c._M_head_impl + 1;
    }
    iVar11 = local_94._M_head_impl + 1;
  }
  std::_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
  ~_Vector_base(&data.
                 super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
               );
  return;
}

Assistant:

void test_3d_dynamic()
{ // {{{
    layout_mapping_left<
        dimensions<dyn, dyn, dyn>, dimensions<1, 1, 1>, dimensions<0, 0, 0>
    > const l(X, Y, Z);

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(1)), true);
    BOOST_TEST_EQ((l.is_dynamic_stride(2)), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), X);
    BOOST_TEST_EQ((l.stride(2)), X * Y);

    BOOST_TEST_EQ((l.size()), l[0] * l[1] * l[2]);
    BOOST_TEST_EQ((l.span()), l[0] * l[1] * l[2]);

    vector<tuple<int, int, int> > data(l[0] * l[1] * l[2]);
    tuple<int, int, int>* dptr = data.data();

    // Set all elements to a unique value.
    for (auto k = 0; k < l[2]; ++k)
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j) + (l[0]) * (l[1]) * (k);

        BOOST_TEST_EQ((l.index(i, j, k)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j, k)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j, k)]) = i;
        std::get<1>(dptr[l.index(i, j, k)]) = j;
        std::get<2>(dptr[l.index(i, j, k)]) = k;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j, k)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j, k)])), j); 
        BOOST_TEST_EQ((std::get<2>(dptr[l.index(i, j, k)])), k); 

        // Bounds-checking.
        BOOST_TEST_EQ((std::get<0>(data.at(l.index(i, j, k)))), i); 
        BOOST_TEST_EQ((std::get<1>(data.at(l.index(i, j, k)))), j); 
        BOOST_TEST_EQ((std::get<2>(data.at(l.index(i, j, k)))), k); 
    }
}